

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_path_fill(nk_draw_list *list,nk_color color)

{
  nk_buffer *pnVar1;
  nk_size nVar2;
  nk_size nVar3;
  nk_vec2 *points;
  
  if (list != (nk_draw_list *)0x0) {
    if (list->buffer == (nk_buffer *)0x0) {
      points = (nk_vec2 *)0x0;
    }
    else {
      points = (nk_vec2 *)(list->buffer->memory).ptr;
    }
    nk_draw_list_fill_poly_convex(list,points,list->path_count,color,(list->config).shape_AA);
    pnVar1 = list->buffer;
    if (pnVar1 != (nk_buffer *)0x0) {
      nVar2 = pnVar1->marker[0].offset;
      pnVar1->needed = pnVar1->needed + (nVar2 - pnVar1->allocated);
      nVar3 = 0;
      if (pnVar1->marker[0].active != 0) {
        nVar3 = nVar2;
      }
      pnVar1->allocated = nVar3;
      pnVar1->marker[0].active = 0;
    }
    list->path_count = 0;
    list->path_offset = 0;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_fill(struct nk_draw_list *list, struct nk_color color)
{
struct nk_vec2 *points;
NK_ASSERT(list);
if (!list) return;
points = (struct nk_vec2*)nk_buffer_memory(list->buffer);
nk_draw_list_fill_poly_convex(list, points, list->path_count, color, list->config.shape_AA);
nk_draw_list_path_clear(list);
}